

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

ssize_t __thiscall
ft::list<int,_ft::allocator<int>_>::splice
          (list<int,_ft::allocator<int>_> *this,int __fdin,__off64_t *__offin,int __fdout,
          __off64_t *__offout,size_t __len,uint __flags)

{
  bool bVar1;
  undefined7 extraout_var;
  node *pnVar3;
  node *pnVar4;
  Node *Node;
  size_type sVar5;
  undefined4 in_register_00000034;
  node *last;
  node *first;
  list<int,_ft::allocator<int>_> *x_local;
  iterator *position_local;
  list<int,_ft::allocator<int>_> *this_local;
  list<int,_ft::allocator<int>_> *plVar2;
  
  plVar2 = this;
  if (this != (list<int,_ft::allocator<int>_> *)__offin) {
    bVar1 = empty((list<int,_ft::allocator<int>_> *)__offin);
    plVar2 = (list<int,_ft::allocator<int>_> *)CONCAT71(extraout_var,bVar1);
    if (!bVar1) {
      pnVar3 = head((list<int,_ft::allocator<int>_> *)__offin);
      pnVar3 = pnVar3->next;
      pnVar4 = tail((list<int,_ft::allocator<int>_> *)__offin);
      pnVar4 = pnVar4->prev;
      unlinkNodes(this,pnVar3,pnVar4);
      Node = listIterator<int>::node((listIterator<int> *)CONCAT44(in_register_00000034,__fdin));
      linkNodes(this,Node,pnVar3,pnVar4);
      sVar5 = size((list<int,_ft::allocator<int>_> *)__offin);
      this->m_size = sVar5 + this->m_size;
      __offin[2] = 0;
      plVar2 = (list<int,_ft::allocator<int>_> *)__offin;
    }
  }
  return (ssize_t)plVar2;
}

Assistant:

void splice(iterator position, list & x) {
		if (this != &x && !x.empty()) {
			node*	first = x.head()->next;
			node*	last = x.tail()->prev;
			this->unlinkNodes(first, last);
			this->linkNodes(position.node(), first, last);
			this->m_size += x.size();
			x.m_size = 0;
		}
	}